

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
* __thiscall
math::wide_integer::uintwide_t<256u,unsigned_short,void,true>::operator>>=
          (uintwide_t<256u,unsigned_short,void,true> *this,int n)

{
  short sVar1;
  long lVar2;
  
  if (n < 0) {
    operator<<=(this,-n);
  }
  else if (n != 0) {
    if ((uint)n < 0x100) {
      uintwide_t<256U,_unsigned_short,_void,_true>::shr<int>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)this,n);
    }
    else {
      sVar1 = *(short *)(this + 0x1e);
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
        *(short *)(this + lVar2) = (short)((uint)(int)sVar1 >> 0xf);
      }
    }
  }
  return (enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value),_uintwide_t<256U,_unsigned_short,_void,_true>_>
          *)this;
}

Assistant:

constexpr auto operator>>=(const SignedIntegralType n) -> std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                                                                && std::is_signed  <SignedIntegralType>::value), uintwide_t>&
    {
      // Implement right-shift operator for signed integral argument.
      if(n < static_cast<SignedIntegralType>(0))
      {
        using local_unsigned_type =
          typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<SignedIntegralType>::digits + 1)>::exact_unsigned_type;

        operator<<=(static_cast<local_unsigned_type>(detail::negate(n)));
      }
      else if(n > static_cast<SignedIntegralType>(0))
      {
        if(exceeds_width(n))
        {
          // Fill with either 0's or 1's. Note also the implementation-defined
          // behavior of excessive right-shift of negative value.

          // Exclude this line from code coverage, even though explicit
          // test cases (search for "result_overshift_is_ok") are known
          // to cover this line.
          detail::fill_unsafe(values.begin(), values.end(), right_shift_fill_value()); // LCOV_EXCL_LINE
        }
        else
        {
          shr(n);
        }
      }

      return *this;
    }